

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask29_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  
  auVar1 = *(undefined1 (*) [16])(in + 5);
  auVar10 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 1),_DAT_00197ea0);
  auVar5 = vpsllvd_avx2(*(undefined1 (*) [32])(in + 1),_DAT_00195600);
  auVar4 = vpshufd_avx(auVar1,0xe9);
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_00197eb0);
  auVar8 = valignd_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar10),7);
  auVar8 = vpblendd_avx2(auVar8,ZEXT432(*in),1);
  auVar9 = vpbroadcastd_avx512vl();
  uVar2 = in[10];
  auVar8 = vpblendd_avx2(auVar8,auVar9,0x20);
  auVar9._0_8_ = auVar4._0_8_;
  auVar9._8_8_ = auVar9._0_8_;
  auVar9._16_8_ = auVar9._0_8_;
  auVar9._24_8_ = auVar9._0_8_;
  auVar8 = vpblendd_avx2(auVar8,auVar9,0xc0);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x4010018));
  auVar8 = vpor_avx2(auVar5,auVar8);
  *(undefined1 (*) [32])out = auVar8;
  vpmovsxbd_avx(ZEXT416(0x34302c24));
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(uVar2 << 2)));
  auVar10 = vshufps_avx(auVar1,auVar7,0x9f);
  auVar1 = vpinsrd_avx(auVar10,uVar2 << 2,1);
  auVar6 = vpsrlvd_avx2(auVar10,auVar4);
  uVar3 = *(ulong *)(in + 0xe);
  auVar4 = vpinsrd_avx(auVar4,auVar7._0_4_ >> 0x1b,1);
  auVar10 = vpsllvd_avx2(auVar7,_DAT_001a4760);
  auVar1 = vpor_avx(auVar1,auVar4);
  auVar1 = vpblendd_avx2(auVar6,auVar1,2);
  auVar1 = vpor_avx(auVar10,auVar1);
  *(undefined1 (*) [16])(out + 8) = auVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar3;
  auVar1 = vpalignr_avx(auVar10,auVar7,0xc);
  auVar4 = vpsrlvd_avx2(auVar1,_DAT_001a4770);
  auVar1 = vpsllvd_avx2(auVar10,_DAT_001a4780);
  auVar1 = vpor_avx(auVar1,auVar4);
  *(long *)(out + 0xc) = auVar1._0_8_;
  out[0xe] = (uint)(uVar3 >> 0x2d);
  return out + 0xf;
}

Assistant:

uint32_t *__fastpackwithoutmask29_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (29 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (29 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (29 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (29 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (29 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (29 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (29 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (29 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++out;
  *out = ((*in)) >> (29 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (29 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (29 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (29 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (29 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (29 - 16);
  ++in;

  return out + 1;
}